

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

Type * __thiscall slang::ast::MultiPortSymbol::getType(MultiPortSymbol *this)

{
  SymbolKind SVar1;
  Scope *pSVar2;
  SyntaxNode *this_00;
  Compilation *this_01;
  size_t sVar3;
  pointer ppPVar4;
  PortSymbol *this_02;
  bitmask<slang::ast::IntegralFlags> bVar5;
  bool bVar6;
  bitwidth_t bVar7;
  Type *this_03;
  Type *pTVar8;
  Diagnostic *diag;
  bitwidth_t width;
  long lVar9;
  bitmask<slang::ast::IntegralFlags> flags;
  LookupLocation LVar10;
  SourceRange range;
  ASTContext context;
  ASTContext local_68;
  
  if (this->type != (Type *)0x0) {
    return this->type;
  }
  pSVar2 = (this->super_Symbol).parentScope;
  this_00 = (this->super_Symbol).originatingSyntax;
  this_01 = pSVar2->compilation;
  LVar10 = LookupLocation::before(&this->super_Symbol);
  local_68.lookupIndex = LVar10.index;
  local_68.flags.m_bits = 0x20;
  local_68.instanceOrProc = (Symbol *)0x0;
  local_68.firstTempVar = (TempVarSymbol *)0x0;
  local_68.randomizeDetails = (RandomizeDetails *)0x0;
  local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
  sVar3 = (this->ports)._M_extent._M_extent_value;
  if (sVar3 != 0) {
    ppPVar4 = (this->ports)._M_ptr;
    lVar9 = 0;
    width = 0;
    flags.m_bits = '\0';
    local_68.scope.ptr = pSVar2;
    do {
      this_02 = *(PortSymbol **)((long)ppPVar4 + lVar9);
      this_03 = PortSymbol::getType(this_02);
      pTVar8 = this_03->canonical;
      if (pTVar8 == (Type *)0x0) {
        Type::resolveCanonical(this_03);
        pTVar8 = this_03->canonical;
      }
      SVar1 = (pTVar8->super_Symbol).kind;
      if ((SVar1 == ErrorType) || (SVar1 == UntypedType)) {
LAB_0036d59b:
        pTVar8 = this_01->errorType;
        goto LAB_0036d5ab;
      }
      bVar6 = Type::isIntegral(this_03);
      if (!bVar6) {
        diag = ASTContext::addDiag(&local_68,(DiagCode)0x210007,this_02->externalLoc);
        ast::operator<<(diag,this_03);
        goto LAB_0036d59b;
      }
      bVar7 = Type::getBitWidth(this_03);
      width = width + bVar7;
      range = slang::syntax::SyntaxNode::sourceRange(this_00);
      bVar6 = ASTContext::requireValidBitWidth(&local_68,width,range);
      if (!bVar6) goto LAB_0036d59b;
      bVar6 = Type::isFourState(this_03);
      bVar5.m_bits = '\x02';
      if (!bVar6) {
        bVar5.m_bits = flags.m_bits;
      }
      flags.m_bits = bVar5.m_bits;
      lVar9 = lVar9 + 8;
    } while (sVar3 << 3 != lVar9);
    if (width != 0) {
      pTVar8 = Compilation::getType(this_01,width,flags);
      goto LAB_0036d5ab;
    }
  }
  pTVar8 = this_01->errorType;
LAB_0036d5ab:
  this->type = pTVar8;
  return pTVar8;
}

Assistant:

const Type& MultiPortSymbol::getType() const {
    if (type)
        return *type;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    auto& comp = scope->getCompilation();

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);
    bitwidth_t totalWidth = 0;
    bitmask<IntegralFlags> flags;

    for (auto port : ports) {
        auto& t = port->getType();
        if (t.isError() || t.isUntypedType()) {
            type = &comp.getErrorType();
            return *type;
        }

        if (!t.isIntegral()) {
            context.addDiag(diag::BadConcatExpression, port->externalLoc) << t;
            type = &comp.getErrorType();
            return *type;
        }

        totalWidth += t.getBitWidth();

        if (!context.requireValidBitWidth(totalWidth, syntax->sourceRange())) {
            type = &comp.getErrorType();
            return *type;
        }

        if (t.isFourState())
            flags |= IntegralFlags::FourState;
    }

    if (totalWidth == 0) {
        type = &comp.getErrorType();
        return *type;
    }

    type = &comp.getType(totalWidth, flags);
    return *type;
}